

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapequad.cpp
# Opt level: O3

void pzshape::TPZShapeQuad::ShapeGenerating
               (TPZVec<double> *pt,TPZVec<int> *nshape,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  double *pdVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  
  lVar5 = 4;
  do {
    if (0 < nshape->fStore[lVar5 + -4]) {
      uVar7 = (ulong)((uint)lVar5 & 3);
      lVar3 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar3 <= (long)uVar7) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar1 = phi->fElem;
      uVar6 = (ulong)((uint)lVar5 + 1 & 3);
      if (lVar3 <= (long)uVar6) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (lVar3 <= lVar5) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar1[lVar5] = pdVar1[uVar7] * pdVar1[uVar6];
      lVar3 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar3 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar7))
      {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar4 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar4 <= (long)uVar6) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (lVar4 <= (long)uVar7) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar4 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar4 < 1) ||
         (lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol, lVar2 <= (long)uVar6)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar1 = dphi->fElem;
      if ((lVar4 < 1) || (lVar2 <= lVar5)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar1[lVar4 * lVar5] =
           dphi->fElem[lVar3 * uVar7] * phi->fElem[uVar6] +
           phi->fElem[uVar7] * pdVar1[lVar4 * uVar6];
      if ((lVar4 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar7))
      {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar3 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar3 <= (long)uVar6) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (lVar3 <= (long)uVar7) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar3 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar3 < 2) ||
         (lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol, lVar2 <= (long)uVar6)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((lVar3 < 2) || (lVar2 <= lVar5)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      dphi->fElem[lVar3 * lVar5 + 1] =
           pdVar1[lVar4 * uVar7 + 1] * phi->fElem[uVar6] +
           phi->fElem[uVar7] * dphi->fElem[uVar6 * lVar3 + 1];
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 8);
  lVar5 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar5 < 1) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar1 = phi->fElem;
  if (lVar5 < 3) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (lVar5 < 9) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar1[8] = *pdVar1 * pdVar1[2];
  if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((2 < (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow) &&
     (0 < (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
    lVar5 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    lVar3 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
    if (lVar3 < 3 || lVar5 < 1) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1 = dphi->fElem;
    if ((lVar5 < 1) || (lVar3 < 9)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar1[lVar5 * 8] = *dphi->fElem * phi->fElem[2] + *phi->fElem * pdVar1[lVar5 * 2];
    if ((lVar5 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar3 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    lVar5 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
    if (lVar5 < 3 || lVar3 < 2) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((lVar3 < 2) || (lVar5 < 9)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    dphi->fElem[lVar3 * 8 + 1] =
         pdVar1[1] * phi->fElem[2] + *phi->fElem * dphi->fElem[lVar3 * 2 + 1];
    lVar5 = 4;
    do {
      if (0 < nshape->fStore[lVar5 + -4]) {
        lVar3 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        if ((lVar3 < 9) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pdVar1 = phi->fElem;
        if (lVar3 <= lVar5) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pdVar1[lVar5] = pdVar1[8] + pdVar1[lVar5];
        lVar3 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        lVar4 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
        if (lVar4 < 9 || lVar3 < 1) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pdVar1 = dphi->fElem;
        if ((lVar3 < 1) || (lVar4 <= lVar5)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pdVar1[lVar3 * lVar5] = pdVar1[lVar3 * 8] + pdVar1[lVar3 * lVar5];
        lVar4 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
        if (lVar4 < 9 || lVar3 < 2) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((lVar3 < 2) || (lVar4 <= lVar5)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pdVar1[lVar3 * lVar5 + 1] = pdVar1[lVar3 * 8 + 1] + pdVar1[lVar3 * lVar5 + 1];
        if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar5) ||
           ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        phi->fElem[lVar5] = phi->fElem[lVar5] * 4.0;
        if ((lVar3 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar5)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pdVar1 = dphi->fElem;
        lVar4 = lVar3 * lVar5;
        pdVar1[lVar4] = pdVar1[lVar4] * 4.0;
        if ((lVar3 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar5)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pdVar1[lVar4 + 1] = pdVar1[lVar4 + 1] * 4.0;
      }
      lVar5 = lVar5 + 1;
      if (lVar5 == 8) {
        if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 9) ||
           ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        phi->fElem[8] = phi->fElem[8] * 16.0;
        if ((0 < lVar3) && (8 < (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
          pdVar1 = dphi->fElem;
          pdVar1[lVar3 * 8] = pdVar1[lVar3 * 8] * 16.0;
          if ((1 < lVar3) && (8 < (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
            pdVar1[lVar3 * 8 + 1] = pdVar1[lVar3 * 8 + 1] * 16.0;
            return;
          }
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
    } while( true );
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void TPZShapeQuad::ShapeGenerating(const TPZVec<REAL> &pt, TPZVec<int> &nshape, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi)
    {
        int is;
        for(is=4; is<8; is++)
        {
            if(nshape[is-NCornerNodes] < 1) continue;
            phi(is,0) = phi(is%4,0)*phi((is+1)%4,0);
            dphi(0,is) = dphi(0,is%4)*phi((is+1)%4,0)+phi(is%4,0)*dphi(0,(is+1)%4);
            dphi(1,is) = dphi(1,is%4)*phi((is+1)%4,0)+phi(is%4,0)*dphi(1,(is+1)%4);
        }
        phi(8,0) = phi(0,0)*phi(2,0);
        dphi(0,8) = dphi(0,0)*phi(2,0)+phi(0,0)*dphi(0,2);
        dphi(1,8) = dphi(1,0)*phi(2,0)+phi(0,0)*dphi(1,2);

        // Make the generating shape functions linear and unitary
        for(is=4; is<8; is++)
        {
            if(nshape[is-NCornerNodes] < 1) continue;
            phi(is,0) += phi(8,0);
            dphi(0,is) += dphi(0,8);
            dphi(1,is) += dphi(1,8);
            phi(is,0) *= 4.;
            dphi(0,is) *= 4.;
            dphi(1,is) *= 4.;
        }
        phi(8,0) *= 16.;
        dphi(0,8) *= 16.;
        dphi(1,8) *= 16.;
    }